

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_table_driven.cc
# Opt level: O2

bool google::protobuf::internal::anon_unknown_16::UnknownFieldHandler::Skip
               (MessageLite *msg,ParseTable *table,CodedInputStream *input,int tag)

{
  bool bVar1;
  LogMessage *other;
  UnknownFieldSet *unknown_fields;
  LogMessage local_70;
  LogFinisher local_31;
  
  if (table->unknown_field_set == false) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/generated_message_table_driven.cc"
               ,0x3c);
    other = LogMessage::operator<<(&local_70,"CHECK failed: table.unknown_field_set: ");
    LogFinisher::operator=(&local_31,other);
    LogMessage::~LogMessage(&local_70);
  }
  unknown_fields = MutableUnknownFields(msg,table->arena_offset);
  bVar1 = WireFormat::SkipField(input,tag,unknown_fields);
  return bVar1;
}

Assistant:

static bool Skip(MessageLite* msg, const ParseTable& table,
                   io::CodedInputStream* input, int tag) {
    GOOGLE_DCHECK(table.unknown_field_set);

    return WireFormat::SkipField(input, tag,
                                 MutableUnknownFields(msg, table.arena_offset));
  }